

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImVec2 new_size;
  float *in_RSI;
  long in_RDI;
  bool bVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  ImVec2 window_00;
  ImVec2 IVar5;
  bool will_have_scrollbar_y;
  bool will_have_scrollbar_x;
  ImVec2 size_auto_fit_after_constraint;
  int monitor_idx;
  ImVec2 avail_size;
  ImVec2 size_min;
  bool is_menu;
  bool is_popup;
  ImVec2 size_desired;
  ImVec2 size_pad;
  ImVec2 size_decorations;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 size_auto_fit;
  ImVec2 *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  ImVec2 *in_stack_ffffffffffffff38;
  ImVec2 *lhs;
  ImGuiWindow *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff48;
  float local_98;
  float fStack_94;
  float in_stack_ffffffffffffff8c;
  undefined1 local_64 [16];
  ImVec2 local_54;
  undefined1 local_4a;
  undefined1 local_49;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImGuiStyle *local_28;
  ImGuiContext *local_20;
  float *local_18;
  long local_10;
  ImVec2 local_8;
  
  local_20 = GImGui;
  local_28 = &GImGui->Style;
  local_18 = in_RSI;
  local_10 = in_RDI;
  fVar3 = ImGuiWindow::TitleBarHeight(in_stack_ffffffffffffff40);
  fVar4 = ImGuiWindow::MenuBarHeight(in_stack_ffffffffffffff40);
  ImVec2::ImVec2(&local_30,0.0,fVar3 + fVar4);
  local_38 = operator*(in_stack_ffffffffffffff28,0.0);
  local_48 = operator+(in_stack_ffffffffffffff28,(ImVec2 *)0x1b7272);
  local_40 = operator+(in_stack_ffffffffffffff28,(ImVec2 *)0x1b728d);
  local_8 = local_40;
  if ((*(uint *)(local_10 + 0xc) & 0x2000000) == 0) {
    local_49 = (*(uint *)(local_10 + 0xc) & 0x4000000) != 0;
    local_4a = (*(uint *)(local_10 + 0xc) & 0x10000000) != 0;
    local_54 = local_28->WindowMinSize;
    if (((bool)local_49) || ((bool)local_4a)) {
      in_stack_ffffffffffffff40 = (ImGuiWindow *)local_64;
      ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff40,4.0,4.0);
      local_64._8_8_ =
           ImMin(in_stack_ffffffffffffff38,
                 (ImVec2 *)
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
      local_54 = (ImVec2)local_64._8_8_;
    }
    if ((*(byte *)(local_10 + 0xae) & 1) != 0) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff8c,3.4028235e+38,3.4028235e+38);
    }
    fVar4 = *(float *)(local_10 + 0x3c);
    if ((-1 < (int)fVar4) && ((int)fVar4 < (local_20->PlatformIO).Monitors.Size)) {
      ImVector<ImGuiPlatformMonitor>::operator[](&(local_20->PlatformIO).Monitors,(int)fVar4);
    }
    operator*(in_stack_ffffffffffffff28,0.0);
    operator-(in_stack_ffffffffffffff28,(ImVec2 *)0x1b742d);
    lhs = &local_54;
    window_00 = ImMax(lhs,(ImVec2 *)
                          CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    IVar5.y = fVar3;
    IVar5.x = in_stack_ffffffffffffff48;
    local_8 = ImClamp((ImVec2 *)in_stack_ffffffffffffff40,lhs,IVar5);
    new_size.y = in_stack_ffffffffffffff8c;
    new_size.x = fVar4;
    IVar5 = CalcWindowSizeAfterConstraint((ImGuiWindow *)window_00,new_size);
    local_98 = IVar5.x;
    if (((*local_18 <= (local_98 - local_38.x) - local_30.x) ||
        ((*(uint *)(local_10 + 0xc) & 8) != 0)) ||
       (bVar1 = true, (*(uint *)(local_10 + 0xc) & 0x800) == 0)) {
      bVar1 = (*(uint *)(local_10 + 0xc) & 0x8000) != 0;
    }
    fStack_94 = IVar5.y;
    if ((local_18[1] <= (fStack_94 - local_38.y) - local_30.y) ||
       (bVar2 = true, (*(uint *)(local_10 + 0xc) & 8) != 0)) {
      bVar2 = (*(uint *)(local_10 + 0xc) & 0x4000) != 0;
    }
    if (bVar1) {
      local_8.y = local_28->ScrollbarSize + local_8.y;
    }
    if (bVar2) {
      local_8.x = local_28->ScrollbarSize + local_8.x;
    }
  }
  return local_8;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        ImVec2 avail_size = window->Viewport->Size;
        if (window->ViewportOwned)
            avail_size = ImVec2(FLT_MAX, FLT_MAX);
        const int monitor_idx = window->ViewportAllowPlatformMonitorExtend;
        if (monitor_idx >= 0 && monitor_idx < g.PlatformIO.Monitors.Size)
            avail_size = g.PlatformIO.Monitors[monitor_idx].WorkSize;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - g.Style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}